

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_InstallCallbacks(GLFWwindow *window)

{
  ImGui_ImplGlfw_Data *pIVar1;
  GLFWwindowfocusfun p_Var2;
  GLFWcursorenterfun p_Var3;
  GLFWcursorposfun p_Var4;
  GLFWmousebuttonfun p_Var5;
  GLFWscrollfun p_Var6;
  GLFWkeyfun p_Var7;
  GLFWcharfun p_Var8;
  GLFWmonitorfun p_Var9;
  
  pIVar1 = ImGui_ImplGlfw_GetBackendData();
  p_Var2 = glfwSetWindowFocusCallback(window,ImGui_ImplGlfw_WindowFocusCallback);
  pIVar1->PrevUserCallbackWindowFocus = p_Var2;
  p_Var3 = glfwSetCursorEnterCallback(window,ImGui_ImplGlfw_CursorEnterCallback);
  pIVar1->PrevUserCallbackCursorEnter = p_Var3;
  p_Var4 = glfwSetCursorPosCallback(window,ImGui_ImplGlfw_CursorPosCallback);
  pIVar1->PrevUserCallbackCursorPos = p_Var4;
  p_Var5 = glfwSetMouseButtonCallback(window,ImGui_ImplGlfw_MouseButtonCallback);
  pIVar1->PrevUserCallbackMousebutton = p_Var5;
  p_Var6 = glfwSetScrollCallback(window,ImGui_ImplGlfw_ScrollCallback);
  pIVar1->PrevUserCallbackScroll = p_Var6;
  p_Var7 = glfwSetKeyCallback(window,ImGui_ImplGlfw_KeyCallback);
  pIVar1->PrevUserCallbackKey = p_Var7;
  p_Var8 = glfwSetCharCallback(window,ImGui_ImplGlfw_CharCallback);
  pIVar1->PrevUserCallbackChar = p_Var8;
  p_Var9 = glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
  pIVar1->PrevUserCallbackMonitor = p_Var9;
  pIVar1->InstalledCallbacks = true;
  return;
}

Assistant:

void ImGui_ImplGlfw_InstallCallbacks(GLFWwindow* window)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd->InstalledCallbacks == false && "Callbacks already installed!");
    IM_ASSERT(bd->Window == window);

    bd->PrevUserCallbackWindowFocus = glfwSetWindowFocusCallback(window, ImGui_ImplGlfw_WindowFocusCallback);
    bd->PrevUserCallbackCursorEnter = glfwSetCursorEnterCallback(window, ImGui_ImplGlfw_CursorEnterCallback);
    bd->PrevUserCallbackCursorPos = glfwSetCursorPosCallback(window, ImGui_ImplGlfw_CursorPosCallback);
    bd->PrevUserCallbackMousebutton = glfwSetMouseButtonCallback(window, ImGui_ImplGlfw_MouseButtonCallback);
    bd->PrevUserCallbackScroll = glfwSetScrollCallback(window, ImGui_ImplGlfw_ScrollCallback);
    bd->PrevUserCallbackKey = glfwSetKeyCallback(window, ImGui_ImplGlfw_KeyCallback);
    bd->PrevUserCallbackChar = glfwSetCharCallback(window, ImGui_ImplGlfw_CharCallback);
    bd->PrevUserCallbackMonitor = glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
    bd->InstalledCallbacks = true;
}